

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteConstantDelta
               (hugeint_t constant,hugeint_t frame_of_reference,idx_t count,hugeint_t *values,
               bool *validity,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint64_t *puVar4;
  bitpacking_metadata_encoded_t encoded_value;
  
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,0x20
             ,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  lVar3 = *(long *)((long)data_ptr + 0x48);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x3000000;
  puVar4 = *(uint64_t **)((long)data_ptr + 0x40);
  *puVar4 = frame_of_reference.lower;
  puVar4[1] = frame_of_reference.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar4 + 2;
  puVar4[2] = constant.lower;
  puVar4[3] = constant.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar4 + 4;
  UpdateStats((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
              count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}